

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QFixed __thiscall QFontEngine::lineThickness(QFontEngine *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int lw;
  int score;
  int local_20;
  QFixed local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)(((double)((uint)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x28) & 0x3ff) *
                *(double *)(in_RDI + 0x68)) / 10.0);
  local_20 = iVar1 / 700;
  if ((local_20 < 2) && (0x419 < iVar1)) {
    local_20 = 2;
  }
  if (local_20 == 0) {
    local_20 = 1;
  }
  QFixed::QFixed(&local_c,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFixed)local_c.val;
  }
  __stack_chk_fail();
}

Assistant:

QFixed QFontEngine::lineThickness() const
{
    // ad hoc algorithm
    int score = fontDef.weight * fontDef.pixelSize / 10;
    int lw = score / 700;

    // looks better with thicker line for small pointsizes
    if (lw < 2 && score >= 1050) lw = 2;
    if (lw == 0) lw = 1;

    return lw;
}